

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DB.cpp
# Opt level: O2

bool __thiscall DB::execSql(DB *this,string *sql)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  MYSQL_RES *pMVar6;
  MYSQL_ROW ppcVar7;
  int j;
  ulong uVar8;
  int i;
  MYSQL_RES *pMVar9;
  
  iVar1 = mysql_query(this->mysql,(sql->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    pMVar6 = (MYSQL_RES *)mysql_use_result(this->mysql);
    this->result = pMVar6;
    pMVar9 = (MYSQL_RES *)0x0;
    if (pMVar6 != (MYSQL_RES *)0x0) {
      uVar2 = mysql_num_fields(pMVar6);
      iVar3 = mysql_num_rows(this->mysql);
      for (; (int)pMVar9 != iVar3; pMVar9 = (MYSQL_RES *)(ulong)((int)pMVar9 + 1)) {
        ppcVar7 = (MYSQL_ROW)mysql_fetch_row(this->result);
        this->row = ppcVar7;
        if (ppcVar7 == (MYSQL_ROW)0x0) break;
        for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,this->row[uVar8]);
          std::operator<<(poVar4,"\t");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      pMVar9 = this->result;
    }
    mysql_free_result(pMVar9);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"query error ");
    pcVar5 = (char *)mysql_error(this->mysql);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return iVar1 == 0;
}

Assistant:

bool DB::execSql(string sql) {
    if (mysql_query(mysql, sql.c_str())) {
        cout << "query error " << mysql_error(mysql) << endl;
        return false;
    } else {
        result = mysql_use_result(mysql);
        if (result) {
            unsigned int num_fields = mysql_num_fields(result);
            unsigned int num_rows = mysql_num_rows(reinterpret_cast<MYSQL_RES *>(mysql));
            for (int i = 0; i < num_rows; i++) {
                row = mysql_fetch_row(result);
                if (!row) break;
                for (int j = 0; j < num_fields; j++) {
                    cout << row[j] << "\t";
                }
                cout << endl;
            }
        }
        mysql_free_result(result);
    }
    return true;
}